

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

void foreach_source_inner
               (CManager_conflict cm,EVstone to_stone,char *seen,ForeachSourceCB cb,
               source_info *info)

{
  int iVar1;
  stone_type p_Var2;
  _proto_action *p_Var3;
  code *in_RCX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  ForeachSourceCB in_R8;
  proto_action *act;
  int matches_recursive;
  int matches;
  int i;
  int was_stalled;
  stone_type stone;
  EVaction cur_action;
  EVstone cur_stone;
  event_path_data evp;
  event_path_data in_stack_ffffffffffffff98;
  int local_50;
  int local_4c;
  int local_48;
  int local_38;
  int local_34;
  source_info *info_00;
  undefined4 in_stack_fffffffffffffff0;
  
  info_00 = *(source_info **)(in_RDI + 0x118);
  for (local_34 = *(int *)&info_00->field_0x4;
      local_34 < info_00->to_stone + *(int *)&info_00->field_0x4; local_34 = local_34 + 1) {
    p_Var2 = stone_struct(in_stack_ffffffffffffff98,0);
    if (((*(char *)(in_RDX + (local_34 - *(int *)&info_00->field_0x4)) == '\0') &&
        (p_Var2 != (stone_type)0x0)) && (p_Var2->local_id != -1)) {
      if (local_34 == in_ESI) {
        if (p_Var2->last_remote_source != (CMConnection_conflict)0x0) {
          *(undefined4 *)(in_R8 + 0x10) = 1;
          *(int *)(in_R8 + 0x14) = local_34;
          *(CMConnection_conflict *)(in_R8 + 0x18) = p_Var2->last_remote_source;
          (*in_RCX)(in_RDI,in_R8);
        }
      }
      else {
        iVar1 = p_Var2->is_stalled;
        local_4c = 0;
        local_50 = 0;
        for (local_48 = 0; local_48 < p_Var2->output_count; local_48 = local_48 + 1) {
          if (in_ESI == p_Var2->output_stone_ids[local_48]) {
            local_4c = local_4c + 1;
            local_50 = local_50 + 1;
          }
        }
        for (local_38 = 0; local_38 < p_Var2->proto_action_count; local_38 = local_38 + 1) {
          p_Var3 = p_Var2->proto_actions + local_38;
          switch(p_Var3->action_type) {
          case Action_Terminal:
            break;
          case Action_Filter:
            if (in_ESI == (p_Var3->o).term.target_stone_id) {
              local_4c = local_4c + 1;
              local_50 = local_50 + 1;
            }
            break;
          case Action_Immediate:
            break;
          default:
            break;
          case Action_Split:
            break;
          case Action_Store:
            if ((p_Var3->o).thr_bri.target_stone_id == in_ESI) {
              local_4c = local_4c + 1;
            }
          }
          if (local_4c != 0) {
            *(undefined4 *)(in_R8 + 0x10) = 0;
            *(int *)(in_R8 + 0x14) = local_34;
            *(int *)(in_R8 + 0x18) = local_38;
            *(int *)(in_R8 + 0x1c) = local_50;
            (*in_RCX)(in_RDI,in_R8);
          }
          if ((iVar1 == 0) && (local_50 != 0)) {
            *(undefined1 *)(in_RDX + (local_34 - *(int *)&info_00->field_0x4)) = 1;
            foreach_source_inner
                      ((CManager_conflict)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                       (EVstone)((ulong)in_RDX >> 0x20),(char *)in_RCX,in_R8,info_00);
            *(undefined1 *)(in_RDX + (local_34 - *(int *)&info_00->field_0x4)) = 0;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void
foreach_source_inner(CManager cm, EVstone to_stone, char *seen,
        ForeachSourceCB cb, struct source_info *info) {
    event_path_data evp = cm->evp;
    EVstone cur_stone;
    for (cur_stone = evp->stone_base_num; cur_stone < evp->stone_count + evp->stone_base_num; ++cur_stone) {
        EVaction cur_action;
        stone_type stone = stone_struct(evp, cur_stone);
        if (seen[cur_stone - evp->stone_base_num]) continue;
	if (!stone) continue;
        if (stone->local_id == -1) continue;
        if (cur_stone == to_stone) {
            if (stone->last_remote_source != NULL) {
                info->type = SOURCE_REMOTE;
                info->stone = cur_stone;
                info->u.remote.conn = stone->last_remote_source;
                cb(cm, info);
            }
        } else {
            int was_stalled = stone->is_stalled;
	    int i;
	    int matches = 0;
	    int matches_recursive = 0;
	    for (i = 0; i < stone->output_count; ++i) {
		if (to_stone == stone->output_stone_ids[i]) {
		    ++matches;
		    ++matches_recursive;
		}
	    }
            for (cur_action = 0; cur_action < stone->proto_action_count; ++cur_action) {
                proto_action *act;
                act = &stone->proto_actions[cur_action];
                switch (act->action_type) {
                case Action_Store:
                    if (act->o.store.target_stone_id == to_stone) {
                        ++matches;
                    }
                    break;
                case Action_Split:
                    break;
                case Action_Filter:
                    if (to_stone == act->o.term.target_stone_id) {
                        ++matches;
                        ++matches_recursive;
                    }
                    break;
                case Action_Immediate:
                    break;
                case Action_Terminal:
                    /* nothing to do */
                    break;
                default: ;
                    /* printf("source searching: unhandled type %d\n", act->action_type); */
                    /* TODO unhandled cases
                            - Source handles?
                     */
                }
                if (matches) {
                    info->type = SOURCE_ACTION;
                    info->stone = cur_stone;
                    info->u.action.action = cur_action;
                    info->u.action.would_recurse = matches_recursive;
                    cb(cm, info);
                }
                /* If a stone is stalled, conceptually no traffic is going to it.
                 * Note that the only way we should be trying to recurse through
                 * a stalled stone is if it were manually stalled.
                 */
                if (!was_stalled && matches_recursive) {
                    /* avoid infinite recursion */
                    seen[cur_stone - evp->stone_base_num] = 1;
                    foreach_source_inner(cm, cur_stone, seen, cb, info);
                    seen[cur_stone - evp->stone_base_num] = 0; /* XXX */
                }
            }
        }
    }
}